

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMurHash.c
# Opt level: O2

uint32_t PMurHash32_Result(uint32_t h,uint32_t carry,uint32_t total_length)

{
  uint uVar1;
  
  if ((carry & 3) != 0) {
    uVar1 = carry >> (-(char)((carry & 3) << 3) & 0x1fU);
    h = h ^ (uVar1 * -0x3361d2af >> 0x11 | uVar1 * 0x16a88000) * 0x1b873593;
  }
  uVar1 = ((h ^ total_length) >> 0x10 ^ h ^ total_length) * -0x7a143595;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51cb;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

uint32_t PMurHash32_Result(uint32_t h, uint32_t carry, uint32_t total_length)
{
  uint32_t k1;
  int n = carry & 3;
  if(n) {
    k1 = carry >> (4-n)*8;
    k1 *= C1; k1 = ROTL32(k1,15); k1 *= C2; h ^= k1;
  }
  h ^= total_length;

  /* fmix */
  h ^= h >> 16;
  h *= 0x85ebca6b;
  h ^= h >> 13;
  h *= 0xc2b2ae35;
  h ^= h >> 16;

  return h;
}